

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Vector4f *in_RDX;
  float *pfVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  Vector4f VVar8;
  
  Vector4f::Vector4f((Vector4f *)m,0.0,0.0,0.0,0.0);
  lVar6 = 0;
  do {
    lVar7 = 0;
    pfVar5 = v->m_elements;
    do {
      fVar1 = *pfVar5;
      pfVar4 = Vector4f::operator[](in_RDX,(int)lVar7);
      fVar2 = *pfVar4;
      pfVar4 = Vector4f::operator[]((Vector4f *)m,(int)lVar6);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
      *pfVar4 = auVar3._0_4_;
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + 4;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    v = (Vector4f *)((long)v + 4);
  } while (lVar6 != 4);
  VVar8.m_elements[1] = 0.0;
  VVar8.m_elements[0] = fVar1;
  VVar8.m_elements._8_8_ = auVar3._0_8_;
  return (Vector4f)VVar8.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}